

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int iVar1;
  xmlOutputBufferPtr out;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  xmlChar *str1;
  int *piVar7;
  bool bVar8;
  int local_a4;
  int local_94;
  int local_84;
  int local_74;
  xmlChar *httpequiv;
  xmlOutputBufferPtr buf;
  xmlChar *end;
  xmlChar *start;
  xmlNodePtr unformattedNode;
  xmlNodePtr root;
  xmlNodePtr tmp;
  int addmeta;
  int format;
  xmlNodePtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  iVar1 = ctxt->format;
  start = (xmlChar *)0x0;
  out = ctxt->buf;
  _addmeta = (xmlDocPtr)cur;
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
LAB_00205575:
  switch(_addmeta->type) {
  case XML_ELEMENT_NODE:
    bVar8 = false;
    if (((_addmeta != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar7 = __xmlIndentTreeOutput(), *piVar7 != 0)) {
      if (ctxt->indent_nr < ctxt->level) {
        local_74 = ctxt->indent_nr;
      }
      else {
        local_74 = ctxt->level;
      }
      xmlOutputBufferWrite(out,ctxt->indent_size * local_74,ctxt->indent);
    }
    xmlOutputBufferWrite(out,1,"<");
    lVar2._0_4_ = _addmeta->compression;
    lVar2._4_4_ = _addmeta->standalone;
    if ((lVar2 != 0) && (*(long *)(*(long *)&_addmeta->compression + 0x18) != 0)) {
      xmlOutputBufferWriteString(out,*(char **)(*(long *)&_addmeta->compression + 0x18));
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,_addmeta->name);
    if (_addmeta->oldNs != (_xmlNs *)0x0) {
      xmlNsListDumpOutputCtxt(ctxt,_addmeta->oldNs);
    }
    iVar6 = xmlStrEqual((xmlChar *)_addmeta->name,"html");
    if (((iVar6 != 0) &&
        (lVar3._0_4_ = _addmeta->compression, lVar3._4_4_ = _addmeta->standalone, lVar3 == 0)) &&
       (_addmeta->oldNs == (_xmlNs *)0x0)) {
      xmlOutputBufferWriteString(out," xmlns=\"http://www.w3.org/1999/xhtml\"");
    }
    if (_addmeta->extSubset != (_xmlDtd *)0x0) {
      xhtmlAttrListDumpOutput(ctxt,(xmlAttrPtr)_addmeta->extSubset);
    }
    if (((_addmeta->parent != (_xmlNode *)0x0) &&
        ((_xmlDoc *)_addmeta->parent->parent == _addmeta->doc)) &&
       ((iVar6 = xmlStrEqual((xmlChar *)_addmeta->name,"head"), iVar6 != 0 &&
        (iVar6 = xmlStrEqual(_addmeta->parent->name,"html"), iVar6 != 0)))) {
      for (root = _addmeta->children; root != (xmlNodePtr)0x0; root = root->next) {
        iVar6 = xmlStrEqual(root->name,(xmlChar *)"meta");
        if ((iVar6 != 0) &&
           (str1 = xmlGetProp(root,(xmlChar *)"http-equiv"), str1 != (xmlChar *)0x0)) {
          iVar6 = xmlStrcasecmp(str1,(xmlChar *)"Content-Type");
          if (iVar6 == 0) {
            (*xmlFree)(str1);
            break;
          }
          (*xmlFree)(str1);
        }
      }
      bVar8 = root == (xmlNodePtr)0x0;
    }
    if (_addmeta->children != (_xmlNode *)0x0) {
      xmlOutputBufferWrite(out,1,">");
      if (bVar8) {
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(out,1,"\n");
          piVar7 = __xmlIndentTreeOutput();
          if (*piVar7 != 0) {
            if (ctxt->indent_nr < ctxt->level + 1) {
              local_94 = ctxt->indent_nr;
            }
            else {
              local_94 = ctxt->level + 1;
            }
            xmlOutputBufferWrite(out,ctxt->indent_size * local_94,ctxt->indent);
          }
        }
        xmlOutputBufferWriteString
                  (out,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
        if (ctxt->encoding == (xmlChar *)0x0) {
          xmlOutputBufferWrite(out,5,"UTF-8");
        }
        else {
          xmlOutputBufferWriteString(out,(char *)ctxt->encoding);
        }
        xmlOutputBufferWrite(out,4,"\" />");
      }
      if (ctxt->format == 1) {
        for (root = _addmeta->children; root != (xmlNodePtr)0x0; root = root->next) {
          if ((root->type == XML_TEXT_NODE) || (root->type == XML_ENTITY_REF_NODE)) {
            start = (xmlChar *)_addmeta;
            ctxt->format = 0;
            break;
          }
        }
      }
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(out,1,"\n");
      }
      if (-1 < ctxt->level) {
        ctxt->level = ctxt->level + 1;
      }
      _addmeta = (xmlDocPtr)_addmeta->children;
      goto LAB_00205575;
    }
    lVar4._0_4_ = _addmeta->compression;
    lVar4._4_4_ = _addmeta->standalone;
    if ((((lVar4 != 0) && (*(long *)(*(long *)&_addmeta->compression + 0x18) != 0)) ||
        (iVar6 = xhtmlIsEmpty((xmlNodePtr)_addmeta), iVar6 != 1)) || (bVar8)) {
      if (bVar8) {
        xmlOutputBufferWrite(out,1,">");
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(out,1,"\n");
          piVar7 = __xmlIndentTreeOutput();
          if (*piVar7 != 0) {
            if (ctxt->indent_nr < ctxt->level + 1) {
              local_84 = ctxt->indent_nr;
            }
            else {
              local_84 = ctxt->level + 1;
            }
            xmlOutputBufferWrite(out,ctxt->indent_size * local_84,ctxt->indent);
          }
        }
        xmlOutputBufferWriteString
                  (out,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
        if (ctxt->encoding == (xmlChar *)0x0) {
          xmlOutputBufferWrite(out,5,"UTF-8");
        }
        else {
          xmlOutputBufferWriteString(out,(char *)ctxt->encoding);
        }
        xmlOutputBufferWrite(out,4,"\" />");
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(out,1,"\n");
        }
      }
      else {
        xmlOutputBufferWrite(out,1,">");
      }
      xmlOutputBufferWrite(out,2,"</");
      lVar5._0_4_ = _addmeta->compression;
      lVar5._4_4_ = _addmeta->standalone;
      if ((lVar5 != 0) && (*(long *)(*(long *)&_addmeta->compression + 0x18) != 0)) {
        xmlOutputBufferWriteString(out,*(char **)(*(long *)&_addmeta->compression + 0x18));
        xmlOutputBufferWrite(out,1,":");
      }
      xmlOutputBufferWriteString(out,_addmeta->name);
      xmlOutputBufferWrite(out,1,">");
    }
    else {
      xmlOutputBufferWrite(out,3," />");
    }
    break;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)_addmeta);
    break;
  case XML_TEXT_NODE:
    if (_addmeta->intSubset != (_xmlDtd *)0x0) {
      if (((xmlChar *)_addmeta->name == "text") || ((xmlChar *)_addmeta->name != "textnoenc")) {
        xmlOutputBufferWriteEscape(out,(xmlChar *)_addmeta->intSubset,ctxt->escape);
      }
      else {
        xmlOutputBufferWriteString(out,(char *)_addmeta->intSubset);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if ((_addmeta->intSubset == (_xmlDtd *)0x0) || (*(char *)&_addmeta->intSubset->_private == '\0')
       ) {
      xmlOutputBufferWrite(out,0xc,"<![CDATA[]]>");
    }
    else {
      buf = (xmlOutputBufferPtr)_addmeta->intSubset;
      end = (xmlChar *)buf;
      for (; *(char *)&buf->context != '\0'; buf = (xmlOutputBufferPtr)((long)&buf->context + 1)) {
        if (((*(char *)&buf->context == ']') && (*(char *)((long)&buf->context + 1) == ']')) &&
           (*(char *)((long)&buf->context + 2) == '>')) {
          buf = (xmlOutputBufferPtr)((long)&buf->context + 2);
          xmlOutputBufferWrite(out,9,"<![CDATA[");
          xmlOutputBufferWrite(out,(int)buf - (int)end,(char *)end);
          xmlOutputBufferWrite(out,3,"]]>");
          end = (xmlChar *)buf;
        }
      }
      if ((xmlOutputBufferPtr)end != buf) {
        xmlOutputBufferWrite(out,9,"<![CDATA[");
        xmlOutputBufferWriteString(out,(char *)end);
        xmlOutputBufferWrite(out,3,"]]>");
      }
    }
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,_addmeta->name);
    xmlOutputBufferWrite(out,1,";");
    break;
  default:
    break;
  case XML_PI_NODE:
    if (_addmeta->intSubset == (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(out,2,"<?");
      xmlOutputBufferWriteString(out,_addmeta->name);
      xmlOutputBufferWrite(out,2,"?>");
    }
    else {
      xmlOutputBufferWrite(out,2,"<?");
      xmlOutputBufferWriteString(out,_addmeta->name);
      if (_addmeta->intSubset != (_xmlDtd *)0x0) {
        xmlOutputBufferWrite(out,1," ");
        xmlOutputBufferWriteString(out,(char *)_addmeta->intSubset);
      }
      xmlOutputBufferWrite(out,2,"?>");
    }
    break;
  case XML_COMMENT_NODE:
    if (_addmeta->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(out,4,"<!--");
      xmlOutputBufferWriteString(out,(char *)_addmeta->intSubset);
      xmlOutputBufferWrite(out,3,"-->");
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,_addmeta);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if (_addmeta->children == (_xmlNode *)0x0) break;
    _addmeta = (xmlDocPtr)_addmeta->children;
    goto LAB_00205575;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)_addmeta);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(out->buffer,(xmlElementPtr)_addmeta);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(out->buffer,(xmlAttributePtr)_addmeta);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(out->buffer,(xmlEntityPtr)_addmeta);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutputCtxt(ctxt,(xmlNsPtr)_addmeta);
  }
  while( true ) {
    if (_addmeta == (xmlDocPtr)cur) {
      return;
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    if (_addmeta->next != (_xmlNode *)0x0) break;
    if (_addmeta->parent == (_xmlNode *)0x0) {
      return;
    }
    _addmeta = (xmlDocPtr)_addmeta->parent;
    if (_addmeta->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar7 = __xmlIndentTreeOutput();
      if ((*piVar7 != 0) && (ctxt->format == 1)) {
        if (ctxt->indent_nr < ctxt->level) {
          local_a4 = ctxt->indent_nr;
        }
        else {
          local_a4 = ctxt->level;
        }
        xmlOutputBufferWrite(out,ctxt->indent_size * local_a4,ctxt->indent);
      }
      xmlOutputBufferWrite(out,2,"</");
      if ((*(xmlNs **)&_addmeta->compression != (xmlNs *)0x0) &&
         ((*(xmlNs **)&_addmeta->compression)->prefix != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(out,(char *)(*(xmlNs **)&_addmeta->compression)->prefix);
        xmlOutputBufferWrite(out,1,":");
      }
      xmlOutputBufferWriteString(out,_addmeta->name);
      xmlOutputBufferWrite(out,1,">");
      if (_addmeta == (xmlDocPtr)start) {
        ctxt->format = iVar1;
        start = (xmlChar *)0x0;
      }
    }
  }
  _addmeta = (xmlDocPtr)_addmeta->next;
  goto LAB_00205575;
}

Assistant:

static void
xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format, addmeta;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf = ctxt->buf;

    if (cur == NULL) return;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_NAMESPACE_DECL:
	    xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
	    break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children) {
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    break;

        case XML_ELEMENT_NODE:
            addmeta = 0;

	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }

            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            if ((xmlStrEqual(cur->name, BAD_CAST "html") &&
                (cur->ns == NULL) && (cur->nsDef == NULL))) {
                /*
                 * 3.1.1. Strictly Conforming Documents A.3.1.1 3/
                 */
                xmlOutputBufferWriteString(buf,
                        " xmlns=\"http://www.w3.org/1999/xhtml\"");
            }
            if (cur->properties != NULL)
                xhtmlAttrListDumpOutput(ctxt, cur->properties);

            if ((cur->parent != NULL) &&
                (cur->parent->parent == (xmlNodePtr) cur->doc) &&
                xmlStrEqual(cur->name, BAD_CAST"head") &&
                xmlStrEqual(cur->parent->name, BAD_CAST"html")) {

                tmp = cur->children;
                while (tmp != NULL) {
                    if (xmlStrEqual(tmp->name, BAD_CAST"meta")) {
                        xmlChar *httpequiv;

                        httpequiv = xmlGetProp(tmp, BAD_CAST"http-equiv");
                        if (httpequiv != NULL) {
                            if (xmlStrcasecmp(httpequiv,
                                        BAD_CAST"Content-Type") == 0) {
                                xmlFree(httpequiv);
                                break;
                            }
                            xmlFree(httpequiv);
                        }
                    }
                    tmp = tmp->next;
                }
                if (tmp == NULL)
                    addmeta = 1;
            }

            if (cur->children == NULL) {
                if (((cur->ns == NULL) || (cur->ns->prefix == NULL)) &&
                    ((xhtmlIsEmpty(cur) == 1) && (addmeta == 0))) {
                    /*
                     * C.2. Empty Elements
                     */
                    xmlOutputBufferWrite(buf, 3, " />");
                } else {
                    if (addmeta == 1) {
                        xmlOutputBufferWrite(buf, 1, ">");
                        if (ctxt->format == 1) {
                            xmlOutputBufferWrite(buf, 1, "\n");
                            if (xmlIndentTreeOutput)
                                xmlOutputBufferWrite(buf, ctxt->indent_size *
                                    (ctxt->level + 1 > ctxt->indent_nr ?
                                    ctxt->indent_nr : ctxt->level + 1),
                                    ctxt->indent);
                        }
                        xmlOutputBufferWriteString(buf,
                                "<meta http-equiv=\"Content-Type\" "
                                "content=\"text/html; charset=");
                        if (ctxt->encoding) {
                            xmlOutputBufferWriteString(buf,
                                    (const char *)ctxt->encoding);
                        } else {
                            xmlOutputBufferWrite(buf, 5, "UTF-8");
                        }
                        xmlOutputBufferWrite(buf, 4, "\" />");
                        if (ctxt->format == 1)
                            xmlOutputBufferWrite(buf, 1, "\n");
                    } else {
                        xmlOutputBufferWrite(buf, 1, ">");
                    }
                    /*
                     * C.3. Element Minimization and Empty Element Content
                     */
                    xmlOutputBufferWrite(buf, 2, "</");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                xmlOutputBufferWrite(buf, 1, ">");
                if (addmeta == 1) {
                    if (ctxt->format == 1) {
                        xmlOutputBufferWrite(buf, 1, "\n");
                        if (xmlIndentTreeOutput)
                            xmlOutputBufferWrite(buf, ctxt->indent_size *
                                (ctxt->level + 1 > ctxt->indent_nr ?
                                ctxt->indent_nr : ctxt->level + 1),
                                ctxt->indent);
                    }
                    xmlOutputBufferWriteString(buf,
                            "<meta http-equiv=\"Content-Type\" "
                            "content=\"text/html; charset=");
                    if (ctxt->encoding) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)ctxt->encoding);
                    } else {
                        xmlOutputBufferWrite(buf, 5, "UTF-8");
                    }
                    xmlOutputBufferWrite(buf, 4, "\" />");
                }

                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            unformattedNode = cur;
                            ctxt->format = 0;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }

                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if ((cur->name == xmlStringText) ||
		(cur->name != xmlStringTextNoenc)) {
                xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if (*end == ']' && *(end + 1) == ']' &&
                        *(end + 2) == '>') {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
	    break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (ctxt->format == 1)
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                return;
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
}